

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Image.c
# Opt level: O1

int Llb_Nonlin4NextPartitions(Llb_Mgr_t_conflict *p,Llb_Prt_t **ppPart1,Llb_Prt_t **ppPart2)

{
  Llb_Var_t *pLVar1;
  Llb_Prt_t *pLVar2;
  int iVar3;
  Llb_Var_t *pLVar4;
  Llb_Prt_t *pLVar5;
  Llb_Prt_t *pLVar6;
  long lVar7;
  long lVar8;
  Llb_Prt_t *pLVar9;
  
  Llb_Nonlin4CheckVars(p);
  iVar3 = 0;
  if ((long)p->nVars < 1) {
    pLVar4 = (Llb_Var_t *)0x0;
  }
  else {
    lVar7 = 0;
    pLVar4 = (Llb_Var_t *)0x0;
    do {
      pLVar1 = p->pVars[lVar7];
      if (((pLVar1 != (Llb_Var_t *)0x0) && ((p->nSizeMax == 0 || (pLVar1->nScore <= p->nSizeMax))))
         && ((pLVar4 == (Llb_Var_t *)0x0 || (pLVar1->nScore < pLVar4->nScore)))) {
        pLVar4 = pLVar1;
      }
      lVar7 = lVar7 + 1;
    } while (p->nVars != lVar7);
  }
  if (pLVar4 != (Llb_Var_t *)0x0) {
    lVar7 = (long)pLVar4->vParts->nSize;
    if (lVar7 < 1) {
      pLVar6 = (Llb_Prt_t *)0x0;
      pLVar9 = (Llb_Prt_t *)0x0;
    }
    else {
      lVar8 = 0;
      pLVar9 = (Llb_Prt_t *)0x0;
      pLVar5 = (Llb_Prt_t *)0x0;
      do {
        pLVar2 = p->pParts[pLVar4->vParts->pArray[lVar8]];
        pLVar6 = pLVar2;
        if (pLVar5 != (Llb_Prt_t *)0x0) {
          if (pLVar9 != (Llb_Prt_t *)0x0) {
            if (((pLVar5->nSize <= pLVar2->nSize) &&
                (pLVar6 = pLVar5, pLVar9->nSize <= pLVar2->nSize)) ||
               (pLVar6 = pLVar2, pLVar9->nSize < pLVar5->nSize)) goto LAB_007ddc20;
          }
          pLVar6 = pLVar5;
          pLVar9 = pLVar2;
        }
LAB_007ddc20:
        lVar8 = lVar8 + 1;
        pLVar5 = pLVar6;
      } while (lVar7 != lVar8);
    }
    *ppPart1 = pLVar6;
    *ppPart2 = pLVar9;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int Llb_Nonlin4NextPartitions( Llb_Mgr_t * p, Llb_Prt_t ** ppPart1, Llb_Prt_t ** ppPart2 )
{
    Llb_Var_t * pVar, * pVarBest = NULL;
    Llb_Prt_t * pPart, * pPart1Best = NULL, * pPart2Best = NULL;
    int i;
    Llb_Nonlin4CheckVars( p );
    // find variable with minimum score
    Llb_MgrForEachVar( p, pVar, i )
    {
        if ( p->nSizeMax && pVar->nScore > p->nSizeMax )
            continue;
//        if ( pVarBest == NULL || Vec_IntSize(pVarBest->vParts) * pVarBest->nScore > Vec_IntSize(pVar->vParts) * pVar->nScore )
        if ( pVarBest == NULL || pVarBest->nScore > pVar->nScore )
            pVarBest = pVar;
//        printf( "%d ", pVar->nScore );
    }
//printf( "\n" );
    if ( pVarBest == NULL )
        return 0;
    // find two partitions with minimum size
    Llb_VarForEachPart( p, pVarBest, pPart, i )
    {
        if ( pPart1Best == NULL )
            pPart1Best = pPart;
        else if ( pPart2Best == NULL )
            pPart2Best = pPart;
        else if ( pPart1Best->nSize > pPart->nSize || pPart2Best->nSize > pPart->nSize )
        {
            if ( pPart1Best->nSize > pPart2Best->nSize )
                pPart1Best = pPart;
            else
                pPart2Best = pPart;
        }
    }
//printf( "Selecting %d and parts %d and %d\n", pVarBest->iVar, pPart1Best->nSize, pPart2Best->nSize );
//Extra_bddPrintSupport( p->dd, pPart1Best->bFunc ); printf( "\n" );
//Extra_bddPrintSupport( p->dd, pPart2Best->bFunc ); printf( "\n" );

    *ppPart1 = pPart1Best;
    *ppPart2 = pPart2Best;
    return 1; 
}